

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O2

void TwoBytesKeygen(int maxlen,KeyCallback *c)

{
  long lVar1;
  ulong uVar2;
  int byteA;
  int iVar3;
  ulong uVar4;
  int keylen;
  uint uVar5;
  int i;
  int iVar6;
  ulong uVar7;
  double dVar8;
  long local_150;
  uint8_t key [256];
  
  iVar3 = 0;
  for (iVar6 = 2; iVar6 <= maxlen; iVar6 = iVar6 + 1) {
    dVar8 = chooseK(iVar6,2);
    iVar3 = iVar3 + (int)dVar8;
  }
  iVar6 = 1;
  if (1 < maxlen) {
    iVar6 = maxlen;
  }
  uVar5 = iVar3 * 0xfe01 + -0x1fe +
          (int)((ulong)(iVar6 - 2) * (ulong)(iVar6 - 1) >> 1) * 0xff + iVar6 * 0x1fe;
  printf("Keyset \'TwoBytes\' - up-to-%d-byte keys, %d total keys\n",maxlen,(ulong)uVar5);
  (*c->_vptr_KeyCallback[3])(c,(ulong)uVar5);
  key[0xc0] = '\0';
  key[0xc1] = '\0';
  key[0xc2] = '\0';
  key[0xc3] = '\0';
  key[0xc4] = '\0';
  key[0xc5] = '\0';
  key[0xc6] = '\0';
  key[199] = '\0';
  key[200] = '\0';
  key[0xc9] = '\0';
  key[0xca] = '\0';
  key[0xcb] = '\0';
  key[0xcc] = '\0';
  key[0xcd] = '\0';
  key[0xce] = '\0';
  key[0xcf] = '\0';
  key[0xd0] = '\0';
  key[0xd1] = '\0';
  key[0xd2] = '\0';
  key[0xd3] = '\0';
  key[0xd4] = '\0';
  key[0xd5] = '\0';
  key[0xd6] = '\0';
  key[0xd7] = '\0';
  key[0xd8] = '\0';
  key[0xd9] = '\0';
  key[0xda] = '\0';
  key[0xdb] = '\0';
  key[0xdc] = '\0';
  key[0xdd] = '\0';
  key[0xde] = '\0';
  key[0xdf] = '\0';
  key[0xe0] = '\0';
  key[0xe1] = '\0';
  key[0xe2] = '\0';
  key[0xe3] = '\0';
  key[0xe4] = '\0';
  key[0xe5] = '\0';
  key[0xe6] = '\0';
  key[0xe7] = '\0';
  key[0xe8] = '\0';
  key[0xe9] = '\0';
  key[0xea] = '\0';
  key[0xeb] = '\0';
  key[0xec] = '\0';
  key[0xed] = '\0';
  key[0xee] = '\0';
  key[0xef] = '\0';
  key[0xf0] = '\0';
  key[0xf1] = '\0';
  key[0xf2] = '\0';
  key[0xf3] = '\0';
  key[0xf4] = '\0';
  key[0xf5] = '\0';
  key[0xf6] = '\0';
  key[0xf7] = '\0';
  key[0xf8] = '\0';
  key[0xf9] = '\0';
  key[0xfa] = '\0';
  key[0xfb] = '\0';
  key[0xfc] = '\0';
  key[0xfd] = '\0';
  key[0xfe] = '\0';
  key[0xff] = '\0';
  key[0x80] = '\0';
  key[0x81] = '\0';
  key[0x82] = '\0';
  key[0x83] = '\0';
  key[0x84] = '\0';
  key[0x85] = '\0';
  key[0x86] = '\0';
  key[0x87] = '\0';
  key[0x88] = '\0';
  key[0x89] = '\0';
  key[0x8a] = '\0';
  key[0x8b] = '\0';
  key[0x8c] = '\0';
  key[0x8d] = '\0';
  key[0x8e] = '\0';
  key[0x8f] = '\0';
  key[0x90] = '\0';
  key[0x91] = '\0';
  key[0x92] = '\0';
  key[0x93] = '\0';
  key[0x94] = '\0';
  key[0x95] = '\0';
  key[0x96] = '\0';
  key[0x97] = '\0';
  key[0x98] = '\0';
  key[0x99] = '\0';
  key[0x9a] = '\0';
  key[0x9b] = '\0';
  key[0x9c] = '\0';
  key[0x9d] = '\0';
  key[0x9e] = '\0';
  key[0x9f] = '\0';
  key[0xa0] = '\0';
  key[0xa1] = '\0';
  key[0xa2] = '\0';
  key[0xa3] = '\0';
  key[0xa4] = '\0';
  key[0xa5] = '\0';
  key[0xa6] = '\0';
  key[0xa7] = '\0';
  key[0xa8] = '\0';
  key[0xa9] = '\0';
  key[0xaa] = '\0';
  key[0xab] = '\0';
  key[0xac] = '\0';
  key[0xad] = '\0';
  key[0xae] = '\0';
  key[0xaf] = '\0';
  key[0xb0] = '\0';
  key[0xb1] = '\0';
  key[0xb2] = '\0';
  key[0xb3] = '\0';
  key[0xb4] = '\0';
  key[0xb5] = '\0';
  key[0xb6] = '\0';
  key[0xb7] = '\0';
  key[0xb8] = '\0';
  key[0xb9] = '\0';
  key[0xba] = '\0';
  key[0xbb] = '\0';
  key[0xbc] = '\0';
  key[0xbd] = '\0';
  key[0xbe] = '\0';
  key[0xbf] = '\0';
  key[0x40] = '\0';
  key[0x41] = '\0';
  key[0x42] = '\0';
  key[0x43] = '\0';
  key[0x44] = '\0';
  key[0x45] = '\0';
  key[0x46] = '\0';
  key[0x47] = '\0';
  key[0x48] = '\0';
  key[0x49] = '\0';
  key[0x4a] = '\0';
  key[0x4b] = '\0';
  key[0x4c] = '\0';
  key[0x4d] = '\0';
  key[0x4e] = '\0';
  key[0x4f] = '\0';
  key[0x50] = '\0';
  key[0x51] = '\0';
  key[0x52] = '\0';
  key[0x53] = '\0';
  key[0x54] = '\0';
  key[0x55] = '\0';
  key[0x56] = '\0';
  key[0x57] = '\0';
  key[0x58] = '\0';
  key[0x59] = '\0';
  key[0x5a] = '\0';
  key[0x5b] = '\0';
  key[0x5c] = '\0';
  key[0x5d] = '\0';
  key[0x5e] = '\0';
  key[0x5f] = '\0';
  key[0x60] = '\0';
  key[0x61] = '\0';
  key[0x62] = '\0';
  key[99] = '\0';
  key[100] = '\0';
  key[0x65] = '\0';
  key[0x66] = '\0';
  key[0x67] = '\0';
  key[0x68] = '\0';
  key[0x69] = '\0';
  key[0x6a] = '\0';
  key[0x6b] = '\0';
  key[0x6c] = '\0';
  key[0x6d] = '\0';
  key[0x6e] = '\0';
  key[0x6f] = '\0';
  key[0x70] = '\0';
  key[0x71] = '\0';
  key[0x72] = '\0';
  key[0x73] = '\0';
  key[0x74] = '\0';
  key[0x75] = '\0';
  key[0x76] = '\0';
  key[0x77] = '\0';
  key[0x78] = '\0';
  key[0x79] = '\0';
  key[0x7a] = '\0';
  key[0x7b] = '\0';
  key[0x7c] = '\0';
  key[0x7d] = '\0';
  key[0x7e] = '\0';
  key[0x7f] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  key[0x20] = '\0';
  key[0x21] = '\0';
  key[0x22] = '\0';
  key[0x23] = '\0';
  key[0x24] = '\0';
  key[0x25] = '\0';
  key[0x26] = '\0';
  key[0x27] = '\0';
  key[0x28] = '\0';
  key[0x29] = '\0';
  key[0x2a] = '\0';
  key[0x2b] = '\0';
  key[0x2c] = '\0';
  key[0x2d] = '\0';
  key[0x2e] = '\0';
  key[0x2f] = '\0';
  key[0x30] = '\0';
  key[0x31] = '\0';
  key[0x32] = '\0';
  key[0x33] = '\0';
  key[0x34] = '\0';
  key[0x35] = '\0';
  key[0x36] = '\0';
  key[0x37] = '\0';
  key[0x38] = '\0';
  key[0x39] = '\0';
  key[0x3a] = '\0';
  key[0x3b] = '\0';
  key[0x3c] = '\0';
  key[0x3d] = '\0';
  key[0x3e] = '\0';
  key[0x3f] = '\0';
  for (uVar7 = 2; (long)uVar7 <= (long)maxlen; uVar7 = uVar7 + 1) {
    for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      for (iVar3 = -0xff; iVar3 != 0; iVar3 = iVar3 + 1) {
        key[uVar4] = (uint8_t)iVar3;
        (*c->_vptr_KeyCallback[2])(c,key,uVar7 & 0xffffffff);
      }
      key[uVar4] = '\0';
    }
  }
  local_150 = 1;
  for (uVar7 = 2; (long)uVar7 <= (long)maxlen; uVar7 = uVar7 + 1) {
    uVar4 = 1;
    for (lVar1 = 0; uVar2 = uVar4, lVar1 != local_150; lVar1 = lVar1 + 1) {
      for (; uVar2 < uVar7; uVar2 = uVar2 + 1) {
        for (iVar3 = 1; iVar3 != 0x100; iVar3 = iVar3 + 1) {
          key[lVar1] = (uint8_t)iVar3;
          for (iVar6 = -0xff; iVar6 != 0; iVar6 = iVar6 + 1) {
            key[uVar2] = (uint8_t)iVar6;
            (*c->_vptr_KeyCallback[2])(c,key,uVar7 & 0xffffffff);
          }
          key[uVar2] = '\0';
        }
        key[lVar1] = '\0';
      }
      uVar4 = uVar4 + 1;
    }
    local_150 = local_150 + 1;
  }
  return;
}

Assistant:

void TwoBytesKeygen ( int maxlen, KeyCallback & c )
{
  //----------
  // Compute # of keys

  int keycount = 0;

  for(int i = 2; i <= maxlen; i++) keycount += (int)chooseK(i,2);

  keycount *= 255*255;

  for(int i = 2; i <= maxlen; i++) keycount += i*255;

  printf("Keyset 'TwoBytes' - up-to-%d-byte keys, %d total keys\n", maxlen, keycount);

  c.reserve(keycount);

  //----------
  // Add all keys with one non-zero byte

  uint8_t key[256];

  memset(key,0,256);

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen; byteA++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      c(key,keylen);
    }

    key[byteA] = 0;
  }

  //----------
  // Add all keys with two non-zero bytes

  for(int keylen = 2; keylen <= maxlen; keylen++)
  for(int byteA = 0; byteA < keylen-1; byteA++)
  for(int byteB = byteA+1; byteB < keylen; byteB++)
  {
    for(int valA = 1; valA <= 255; valA++)
    {
      key[byteA] = (uint8_t)valA;

      for(int valB = 1; valB <= 255; valB++)
      {
        key[byteB] = (uint8_t)valB;
        c(key,keylen);
      }

      key[byteB] = 0;
    }

    key[byteA] = 0;
  }
}